

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_types.h
# Opt level: O3

bool __thiscall
icu_63::numparse::impl::CompactUnicodeString<4>::operator==
          (CompactUnicodeString<4> *this,CompactUnicodeString<4> *other)

{
  UBool UVar1;
  bool bVar2;
  ConstChar16Ptr local_b0;
  char16_t *local_a8;
  UObject local_98;
  UnicodeString local_88;
  UnicodeString local_48;
  
  local_88.super_Replaceable.super_UObject._vptr_UObject = (UObject)(this->fBuffer).ptr;
  UnicodeString::UnicodeString(&local_48,'\x01',(ConstChar16Ptr *)&local_88,-1);
  local_98 = local_88.super_Replaceable.super_UObject._vptr_UObject;
  local_b0.p_ = (other->fBuffer).ptr;
  UnicodeString::UnicodeString(&local_88,'\x01',&local_b0,-1);
  local_a8 = local_b0.p_;
  if ((local_48.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_48.fUnion.fStackFields.fLengthAndFlags) {
      local_48.fUnion.fFields.fLength = (int)local_48.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (-1 < local_88.fUnion.fStackFields.fLengthAndFlags) {
      local_88.fUnion.fFields.fLength = (int)local_88.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    bVar2 = false;
    if ((((int)local_88.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
       (bVar2 = false, local_48.fUnion.fFields.fLength == local_88.fUnion.fFields.fLength)) {
      UVar1 = UnicodeString::doEquals(&local_48,&local_88,local_48.fUnion.fFields.fLength);
      bVar2 = UVar1 != '\0';
    }
  }
  else {
    bVar2 = (bool)(local_88.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
  }
  UnicodeString::~UnicodeString(&local_88);
  UnicodeString::~UnicodeString(&local_48);
  return bVar2;
}

Assistant:

bool operator==(const CompactUnicodeString& other) const {
        // Use the alias-only constructor and then call UnicodeString operator==
        return toAliasedUnicodeString() == other.toAliasedUnicodeString();
    }